

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_mode_setting.cpp
# Opt level: O0

spv_result_t spvtools::val::ModeSettingPass(ValidationState_t *_,Instruction *inst)

{
  Op OVar1;
  spv_result_t sVar2;
  spv_result_t error_2;
  spv_result_t error_1;
  spv_result_t error;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  OVar1 = Instruction::opcode(inst);
  if (OVar1 == OpMemoryModel) {
    sVar2 = anon_unknown_1::ValidateMemoryModel(_,inst);
  }
  else if (OVar1 == OpEntryPoint) {
    sVar2 = anon_unknown_1::ValidateEntryPoint(_,inst);
  }
  else {
    if ((OVar1 != OpExecutionMode) && (OVar1 != OpExecutionModeId)) {
      return SPV_SUCCESS;
    }
    sVar2 = anon_unknown_1::ValidateExecutionMode(_,inst);
  }
  if (sVar2 == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return sVar2;
}

Assistant:

spv_result_t ModeSettingPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpEntryPoint:
      if (auto error = ValidateEntryPoint(_, inst)) return error;
      break;
    case spv::Op::OpExecutionMode:
    case spv::Op::OpExecutionModeId:
      if (auto error = ValidateExecutionMode(_, inst)) return error;
      break;
    case spv::Op::OpMemoryModel:
      if (auto error = ValidateMemoryModel(_, inst)) return error;
      break;
    default:
      break;
  }
  return SPV_SUCCESS;
}